

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_DetectModule(char *input,size_t input_len)

{
  int iVar1;
  uint uVar2;
  uint8_t *p;
  uint8_t *local_8;
  
  local_8 = (uint8_t *)input;
  iVar1 = simple_next_token(&local_8,0);
  if (iVar1 == -0x35) {
    uVar2 = 1;
  }
  else if (iVar1 == -0x33) {
    iVar1 = simple_next_token(&local_8,0);
    uVar2 = (uint)(iVar1 != 0x28 && iVar1 != 0x2e);
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

BOOL JS_DetectModule(const char *input, size_t input_len)
{
    const uint8_t *p = (const uint8_t *)input;
    int tok;
    switch(simple_next_token(&p, FALSE)) {
    case TOK_IMPORT:
        tok = simple_next_token(&p, FALSE);
        return (tok != '.' && tok != '(');
    case TOK_EXPORT:
        return TRUE;
    default:
        return FALSE;
    }
}